

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd_fragment.cpp
# Opt level: O1

bool __thiscall
ON_SubDMeshFragment::Internal_GetFrameHelper
          (ON_SubDMeshFragment *this,uint P_dex,uint Q_dex,ON_Plane *frame)

{
  double dVar1;
  bool bVar2;
  uint uVar3;
  uint uVar4;
  long lVar5;
  uint uVar6;
  ON_Plane *pOVar7;
  byte bVar8;
  ON_3dVector Z;
  ON_3dVector Y;
  ON_3dPoint P;
  ON_3dVector X;
  ON_3dVector V;
  ON_3dPoint Q;
  ON_3dVector local_140;
  ON_3dVector local_128;
  ON_3dPoint local_110;
  ON_3dVector local_f8;
  ON_3dVector local_e0;
  ON_3dPoint local_c8;
  ON_Plane local_b0;
  
  bVar8 = 0;
  uVar4 = this->m_vertex_count_etc & 0x1fff;
  uVar3 = 0;
  uVar6 = 0;
  if (2 < this->m_P_stride) {
    uVar6 = uVar4;
  }
  if (this->m_P == (double *)0x0) {
    uVar6 = 0;
  }
  if (uVar6 <= Q_dex || uVar6 <= P_dex) goto LAB_006144f3;
  if (this->m_N_stride < 3) {
    uVar4 = uVar3;
  }
  if (this->m_N == (double *)0x0) {
    uVar4 = 0;
  }
  if (uVar4 != uVar6) goto LAB_006144f3;
  VertexPoint(&local_110,this,P_dex);
  VertexNormal(&local_140,this,P_dex);
  bVar2 = ON_3dPoint::IsValid(&local_110);
  if (bVar2) {
    bVar2 = ON_3dVector::IsNotZero(&local_140);
    if (bVar2) {
      VertexPoint(&local_c8,this,Q_dex);
      ON_3dPoint::operator-((ON_3dVector *)&local_b0,&local_c8,&local_110);
      ON_3dVector::UnitVector(&local_e0,(ON_3dVector *)&local_b0);
      dVar1 = ON_3dVector::operator*(&local_140,&local_e0);
      ::operator*(&local_128,dVar1,&local_140);
      ON_3dVector::operator-((ON_3dVector *)&local_b0,&local_e0,&local_128);
      ON_3dVector::UnitVector(&local_f8,(ON_3dVector *)&local_b0);
      ON_CrossProduct((ON_3dVector *)&local_b0,&local_140,&local_f8);
      ON_3dVector::UnitVector(&local_128,(ON_3dVector *)&local_b0);
      bVar2 = ON_3dVector::IsUnitVector(&local_f8);
      if (bVar2) {
        bVar2 = ON_3dVector::IsUnitVector(&local_128);
        if (!bVar2) goto LAB_006144bd;
        dVar1 = ON_3dVector::operator*(&local_f8,&local_140);
        if (1.490116119385e-08 < ABS(dVar1)) goto LAB_006144bd;
        dVar1 = ON_3dVector::operator*(&local_128,&local_140);
        if (1.490116119385e-08 < ABS(dVar1)) goto LAB_006144bd;
        (frame->origin).z = local_110.z;
        (frame->origin).x = local_110.x;
        (frame->origin).y = local_110.y;
        (frame->xaxis).z = local_f8.z;
        (frame->xaxis).x = local_f8.x;
        (frame->xaxis).y = local_f8.y;
        (frame->yaxis).x = local_128.x;
        (frame->yaxis).y = local_128.y;
        (frame->yaxis).z = local_128.z;
        (frame->zaxis).x = local_140.x;
        (frame->zaxis).y = local_140.y;
        (frame->zaxis).z = local_140.z;
        ON_Plane::UpdateEquation(frame);
      }
      else {
LAB_006144bd:
        ON_Plane::ON_Plane(&local_b0,&local_110,&local_140);
        pOVar7 = &local_b0;
        for (lVar5 = 0x10; lVar5 != 0; lVar5 = lVar5 + -1) {
          (frame->origin).x = (pOVar7->origin).x;
          pOVar7 = (ON_Plane *)((long)pOVar7 + (ulong)bVar8 * -0x10 + 8);
          frame = (ON_Plane *)((long)frame + (ulong)bVar8 * -0x10 + 8);
        }
        ON_Plane::~ON_Plane(&local_b0);
      }
      uVar3 = 1;
      goto LAB_006144f3;
    }
  }
  uVar3 = 0;
LAB_006144f3:
  return SUB41(uVar3,0);
}

Assistant:

bool ON_SubDMeshFragment::Internal_GetFrameHelper(
  unsigned int P_dex,
  unsigned int Q_dex,
  ON_Plane& frame
) const
{
  const unsigned int P_count = PointCount();
  if ( P_dex < P_count
    && Q_dex < P_count
    && NormalCount() == PointCount()
    )
  {
    const ON_3dPoint P(VertexPoint(P_dex));
    const ON_3dVector Z(VertexNormal(P_dex));
    if (P.IsValid() && Z.IsNotZero())
    {
      const ON_3dPoint Q(VertexPoint(Q_dex));
      const ON_3dVector V = (Q - P).UnitVector();
      const ON_3dVector X = (V - (Z*V)*Z).UnitVector();
      const ON_3dVector Y = ON_CrossProduct(Z, X).UnitVector();
      if ( X.IsUnitVector() && Y.IsUnitVector() 
        && fabs(X*Z) <= ON_SQRT_EPSILON
        && fabs(Y*Z) <= ON_SQRT_EPSILON
        )
      {
        frame.origin = P;
        frame.xaxis = X;
        frame.yaxis = Y;
        frame.zaxis = Z;
        frame.UpdateEquation();
      }
      else
      {
        frame = ON_Plane(P, Z);
      }
      return true;
    }
  }
  return false;
}